

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query_base.h
# Opt level: O0

Result * __thiscall
S2ClosestCellQueryBase<S2MinDistance>::FindClosestCell
          (Result *__return_storage_ptr__,S2ClosestCellQueryBase<S2MinDistance> *this,Target *target
          ,Options *options)

{
  undefined4 uVar1;
  int iVar2;
  ostream *poVar3;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  Options *local_20;
  Options *options_local;
  Target *target_local;
  S2ClosestCellQueryBase<S2MinDistance> *this_local;
  
  local_20 = options;
  options_local = (Options *)target;
  target_local = (Target *)this;
  iVar2 = Options::max_results(options);
  if (iVar2 == 1) {
    FindClosestCellsInternal(this,(Target *)options_local,local_20);
    (__return_storage_ptr__->distance_).super_S1ChordAngle.length2_ =
         (this->result_singleton_).distance_.super_S1ChordAngle.length2_;
    (__return_storage_ptr__->cell_id_).id_ = (this->result_singleton_).cell_id_.id_;
    uVar1 = *(undefined4 *)&(this->result_singleton_).field_0x14;
    __return_storage_ptr__->label_ = (this->result_singleton_).label_;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar1;
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_cell_query_base.h"
             ,0x1ea,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_38);
  poVar3 = std::operator<<(poVar3,"Check failed: (options.max_results()) == (1) ");
  S2LogMessageVoidify::operator&(&local_21,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
}

Assistant:

typename S2ClosestCellQueryBase<Distance>::Result
S2ClosestCellQueryBase<Distance>::FindClosestCell(
    Target* target, const Options& options) {
  S2_DCHECK_EQ(options.max_results(), 1);
  FindClosestCellsInternal(target, options);
  return result_singleton_;
}